

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.cpp
# Opt level: O0

void set_htelemeters_vectors_Pololu
               (double *angles,double *distances,int nbhtelemeters,timeval tv,int deviceid)

{
  size_type sVar1;
  long lVar2;
  double local_58;
  interval local_50;
  int local_34;
  int local_30;
  int i;
  int deviceid_local;
  int nbhtelemeters_local;
  double *distances_local;
  double *angles_local;
  timeval tv_local;
  
  tv_local.tv_sec = tv.tv_usec;
  angles_local = (double *)tv.tv_sec;
  local_30 = deviceid;
  i = nbhtelemeters;
  _deviceid_local = distances;
  distances_local = angles;
  for (local_34 = 0; local_34 < i; local_34 = local_34 + 1) {
    alpha_mes_pololu[local_30] = distances_local[local_34];
    d_mes_pololu[local_30] = _deviceid_local[local_34];
    std::vector<interval,_std::allocator<interval>_>::clear(d_all_mes_pololu + local_30);
    lVar2 = (long)local_30;
    interval::interval(&local_50,d_mes_pololu + local_30);
    std::vector<interval,_std::allocator<interval>_>::push_back(d_all_mes_pololu + lVar2,&local_50);
    std::deque<double,_std::allocator<double>_>::push_back
              (alpha_mes_pololu_vector + local_30,alpha_mes_pololu + local_30);
    std::deque<double,_std::allocator<double>_>::push_back
              (d_mes_pololu_vector + local_30,d_mes_pololu + local_30);
    std::
    deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
    ::push_back(d_all_mes_pololu_vector + local_30,d_all_mes_pololu + local_30);
    local_58 = (double)tv_local.tv_sec * 1e-06 + (double)(long)angles_local;
    std::deque<double,_std::allocator<double>_>::push_back
              (t_pololu_history_vector + local_30,&local_58);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (xhat_pololu_history_vector + local_30,(value_type *)&xhat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (yhat_pololu_history_vector + local_30,(value_type *)&yhat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (psihat_pololu_history_vector + local_30,(value_type *)&psihat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (vrxhat_pololu_history_vector + local_30,(value_type *)&vrxhat);
    sVar1 = std::deque<double,_std::allocator<double>_>::size(alpha_mes_pololu_vector + local_30);
    if (i < (int)sVar1) {
      std::deque<double,_std::allocator<double>_>::pop_front(alpha_mes_pololu_vector + local_30);
      std::deque<double,_std::allocator<double>_>::pop_front(d_mes_pololu_vector + local_30);
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::pop_front(d_all_mes_pololu_vector + local_30);
      std::deque<double,_std::allocator<double>_>::pop_front(t_pololu_history_vector + local_30);
      std::deque<interval,_std::allocator<interval>_>::pop_front
                (xhat_pololu_history_vector + local_30);
      std::deque<interval,_std::allocator<interval>_>::pop_front
                (yhat_pololu_history_vector + local_30);
      std::deque<interval,_std::allocator<interval>_>::pop_front
                (psihat_pololu_history_vector + local_30);
      std::deque<interval,_std::allocator<interval>_>::pop_front
                (vrxhat_pololu_history_vector + local_30);
    }
  }
  return;
}

Assistant:

void set_htelemeters_vectors_Pololu(double* angles, double* distances, int nbhtelemeters, struct timeval tv, int deviceid)
{
	int i = 0;

	for (i = 0; i < nbhtelemeters; i++)
	{
		alpha_mes_pololu[deviceid] = angles[i];
		d_mes_pololu[deviceid] = distances[i];

		// For compatibility with a Seanet...
		d_all_mes_pololu[deviceid].clear();
		d_all_mes_pololu[deviceid].push_back(d_mes_pololu[deviceid]);

		alpha_mes_pololu_vector[deviceid].push_back(alpha_mes_pololu[deviceid]);
		d_mes_pololu_vector[deviceid].push_back(d_mes_pololu[deviceid]);
		d_all_mes_pololu_vector[deviceid].push_back(d_all_mes_pololu[deviceid]);
		t_pololu_history_vector[deviceid].push_back(tv.tv_sec+0.000001*tv.tv_usec);
		xhat_pololu_history_vector[deviceid].push_back(xhat);
		yhat_pololu_history_vector[deviceid].push_back(yhat);
		psihat_pololu_history_vector[deviceid].push_back(psihat);
		vrxhat_pololu_history_vector[deviceid].push_back(vrxhat);

		if ((int)alpha_mes_pololu_vector[deviceid].size() > nbhtelemeters)
		{
			alpha_mes_pololu_vector[deviceid].pop_front();
			d_mes_pololu_vector[deviceid].pop_front();
			d_all_mes_pololu_vector[deviceid].pop_front();
			t_pololu_history_vector[deviceid].pop_front();
			xhat_pololu_history_vector[deviceid].pop_front();
			yhat_pololu_history_vector[deviceid].pop_front();
			psihat_pololu_history_vector[deviceid].pop_front();
			vrxhat_pololu_history_vector[deviceid].pop_front();
		}
	}
}